

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t c4::base64_encode(long param_1,ulong param_2,byte *param_3,ulong param_4)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (param_4 < 3) {
    uVar5 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      bVar1 = *param_3;
      bVar2 = param_3[1];
      bVar3 = param_3[2];
      if (uVar5 < param_2) {
        *(undefined1 *)(param_1 + uVar5) = (&detail::base64_sextet_to_char_)[bVar1 >> 2];
      }
      if (uVar5 + 1 < param_2) {
        *(undefined1 *)(param_1 + 1 + uVar5) =
             (&detail::base64_sextet_to_char_)
             [((uint)bVar1 << 0x10 | (uint)bVar2 << 8) >> 0xc & 0x3f];
      }
      if (uVar5 + 2 < param_2) {
        *(undefined1 *)(param_1 + 2 + uVar5) =
             (&detail::base64_sextet_to_char_)[(ushort)(CONCAT11(bVar2,bVar3) >> 6) & 0x3f];
      }
      if (uVar5 + 3 < param_2) {
        *(undefined1 *)(param_1 + 3 + uVar5) = (&detail::base64_sextet_to_char_)[bVar3 & 0x3f];
      }
      param_4 = param_4 - 3;
      param_3 = param_3 + 3;
      uVar4 = uVar5 + 4;
    } while (2 < param_4);
    uVar5 = uVar5 + 4;
  }
  if (param_4 == 1) {
    bVar1 = *param_3;
    if (uVar5 < param_2) {
      *(undefined1 *)(param_1 + uVar5) = (&detail::base64_sextet_to_char_)[bVar1 >> 2];
    }
    if ((uVar5 | 1) < param_2) {
      *(undefined1 *)(param_1 + (uVar5 | 1)) = (&detail::base64_sextet_to_char_)[(bVar1 & 3) << 4];
    }
    if ((uVar5 | 2) < param_2) {
      *(undefined1 *)(param_1 + (uVar5 | 2)) = 0x3d;
    }
  }
  else {
    if (param_4 != 2) {
      return uVar5;
    }
    bVar1 = *param_3;
    bVar2 = param_3[1];
    if (uVar5 < param_2) {
      *(undefined1 *)(param_1 + uVar5) = (&detail::base64_sextet_to_char_)[bVar1 >> 2];
    }
    if ((uVar5 | 1) < param_2) {
      *(undefined1 *)(param_1 + (uVar5 | 1)) =
           (&detail::base64_sextet_to_char_)[((uint)bVar2 << 8 | (uint)bVar1 << 0x10) >> 0xc & 0x3f]
      ;
    }
    if ((uVar5 | 2) < param_2) {
      *(undefined1 *)(param_1 + (uVar5 | 2)) =
           (&detail::base64_sextet_to_char_)[(ulong)(bVar2 & 0xf) * 4];
    }
  }
  if ((uVar5 | 3) < param_2) {
    *(undefined1 *)(param_1 + (uVar5 | 3)) = 0x3d;
  }
  return uVar5 + 4;
}

Assistant:

size_t base64_encode(substr buf, cblob data)
{
    #define c4append_(c) { if(pos < buf.len) { buf.str[pos] = (c); } ++pos; }
    #define c4append_idx_(char_idx) \
    {\
         C4_XASSERT((char_idx) < sizeof(detail::base64_sextet_to_char_));\
         c4append_(detail::base64_sextet_to_char_[(char_idx)]);\
    }

    size_t rem, pos = 0;
    constexpr const uint32_t sextet_mask = uint32_t(1 << 6) - 1;
    const unsigned char *C4_RESTRICT d = (unsigned char *) data.buf; // cast to unsigned to avoid wrapping high-bits
    for(rem = data.len; rem >= 3; rem -= 3, d += 3)
    {
        const uint32_t val = ((uint32_t(d[0]) << 16) | (uint32_t(d[1]) << 8) | (uint32_t(d[2])));
        c4append_idx_((val >> 18) & sextet_mask);
        c4append_idx_((val >> 12) & sextet_mask);
        c4append_idx_((val >>  6) & sextet_mask);
        c4append_idx_((val      ) & sextet_mask);
    }
    C4_ASSERT(rem < 3);
    if(rem == 2)
    {
        const uint32_t val = ((uint32_t(d[0]) << 16) | (uint32_t(d[1]) << 8));
        c4append_idx_((val >> 18) & sextet_mask);
        c4append_idx_((val >> 12) & sextet_mask);
        c4append_idx_((val >>  6) & sextet_mask);
        c4append_('=');
    }
    else if(rem == 1)
    {
        const uint32_t val = ((uint32_t(d[0]) << 16));
        c4append_idx_((val >> 18) & sextet_mask);
        c4append_idx_((val >> 12) & sextet_mask);
        c4append_('=');
        c4append_('=');
    }
    return pos;

    #undef c4append_
    #undef c4append_idx_
}